

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_resolveComponentWithUnitsMissingModel_Test::
Importer_resolveComponentWithUnitsMissingModel_Test
          (Importer_resolveComponentWithUnitsMissingModel_Test *this)

{
  Importer_resolveComponentWithUnitsMissingModel_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Importer_resolveComponentWithUnitsMissingModel_Test_001a1720;
  return;
}

Assistant:

TEST(Importer, resolveComponentWithUnitsMissingModel)
{
    std::string e = "The attempt to resolve imports with the model at '" + resourcePath("importer/") + "missing_model.cellml' failed: the file could not be opened.";

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/importing_component_with_imported_units_missing_model.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto importer = libcellml::Importer::create();
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ(e, importer->issue(0)->description());
}